

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O1

uc_err uc_mem_read(uc_engine *uc,uint64_t address,void *_bytes,size_t size)

{
  bool bVar1;
  _Bool _Var2;
  uc_err uVar3;
  MemoryRegion *pMVar4;
  ulong uVar5;
  hwaddr hVar6;
  ulong uVar7;
  size_t sVar8;
  uint8_t *local_40;
  
  if (((uc->init_done != false) || (uVar3 = uc_init_engine(uc), uVar3 == UC_ERR_OK)) &&
     (uVar3 = UC_ERR_ARG, size < 0x80000000)) {
    _Var2 = check_mem_area(uc,address,size);
    uVar3 = UC_ERR_READ_UNMAPPED;
    if (_Var2) {
      sVar8 = 0;
      local_40 = (uint8_t *)_bytes;
      do {
        uVar5 = size - sVar8;
        if (size < sVar8 || uVar5 == 0) break;
        pMVar4 = (*uc->memory_mapping)(uc,address);
        if (pMVar4 == (MemoryRegion *)0x0) {
LAB_004d3bb6:
          bVar1 = false;
        }
        else {
          hVar6 = pMVar4->end;
          for (pMVar4 = pMVar4->container; pMVar4 != uc->system_memory; pMVar4 = pMVar4->container)
          {
            hVar6 = hVar6 + pMVar4->addr;
          }
          uVar7 = hVar6 - address;
          if (uVar5 <= hVar6 - address) {
            uVar7 = uVar5;
          }
          _Var2 = (*uc->read_mem)(&uc->address_space_memory,address,local_40,(int)uVar7);
          if (!_Var2) goto LAB_004d3bb6;
          sVar8 = sVar8 + uVar7;
          address = address + uVar7;
          local_40 = local_40 + uVar7;
          bVar1 = true;
        }
      } while (bVar1);
      uVar3 = UC_ERR_READ_UNMAPPED;
      if (sVar8 == size) {
        uVar3 = UC_ERR_OK;
      }
    }
  }
  return uVar3;
}

Assistant:

UNICORN_EXPORT
uc_err uc_mem_read(uc_engine *uc, uint64_t address, void *_bytes, size_t size)
{
    size_t count = 0, len;
    uint8_t *bytes = _bytes;

    UC_INIT(uc);

    // qemu cpu_physical_memory_rw() size is an int
    if (size > INT_MAX)
        return UC_ERR_ARG;

    if (!check_mem_area(uc, address, size)) {
        return UC_ERR_READ_UNMAPPED;
    }

    // memory area can overlap adjacent memory blocks
    while (count < size) {
        MemoryRegion *mr = uc->memory_mapping(uc, address);
        if (mr) {
            len = memory_region_len(uc, mr, address, size - count);
            if (uc->read_mem(&uc->address_space_memory, address, bytes, len) ==
                false) {
                break;
            }
            count += len;
            address += len;
            bytes += len;
        } else { // this address is not mapped in yet
            break;
        }
    }

    if (count == size) {
        return UC_ERR_OK;
    } else {
        return UC_ERR_READ_UNMAPPED;
    }
}